

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.h
# Opt level: O0

void phyr::coordinateSystem<double>(Vector3<double> *v1,Vector3<double> *v2,Vector3<double> *v3)

{
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  double *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined8 local_90;
  double in_stack_ffffffffffffff78;
  Vector3<double> *in_stack_ffffffffffffff80;
  Vector3<double> *in_stack_ffffffffffffff98;
  Vector3<double> *in_stack_ffffffffffffffa0;
  undefined8 local_58;
  undefined8 local_50;
  Vector3<double> local_48;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 *local_18;
  undefined8 *local_10;
  double *local_8;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::abs((int)in_RDI);
  std::abs((int)in_RDI);
  if (extraout_XMM0_Qa <= extraout_XMM0_Qa_00) {
    Vector3<double>::Vector3((Vector3<double> *)&stack0xffffffffffffff88,0.0,local_8[2],-local_8[1])
    ;
    sqrt(local_8[1] * local_8[1] + local_8[2] * local_8[2]);
    Vector3<double>::operator/(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    *local_10 = in_stack_ffffffffffffffa0;
    local_10[1] = local_58;
    local_10[2] = local_50;
  }
  else {
    Vector3<double>::Vector3(&local_48,-local_8[2],0.0,*local_8);
    sqrt(*local_8 * *local_8 + local_8[2] * local_8[2]);
    Vector3<double>::operator/(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    *local_10 = local_30;
    local_10[1] = local_28;
    local_10[2] = local_20;
  }
  cross<double>(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  *local_18 = local_90;
  local_18[1] = in_stack_ffffffffffffff78;
  local_18[2] = in_stack_ffffffffffffff80;
  return;
}

Assistant:

inline void coordinateSystem(const Vector3<T>& v1, Vector3<T>* v2, Vector3<T>* v3) {
    ASSERT(v2 != nullptr && v3 != nullptr);
    if (std::abs(v1.x) > std::abs(v1.y))
        *v2 = Vector3<T>(-v1.z, 0, v1.x) / std::sqrt(v1.x * v1.x + v1.z * v1.z);
    else
        *v2 = Vector3<T>(0, v1.z, -v1.y) / std::sqrt(v1.y * v1.y + v1.z * v1.z);
    *v3 = cross(v1, *v2);
}